

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# summarycalc.cpp
# Opt level: O3

void __thiscall summarycalc::outputstreamtype(summarycalc *this,int summary_set)

{
  int iVar1;
  int *piVar2;
  int streamtype;
  undefined4 local_24;
  timespec local_20;
  
  local_24 = 0x3000001;
  fwrite(&local_24,4,1,(FILE *)this->fout[summary_set]);
  this->offset_[summary_set] = this->offset_[summary_set] + 4;
  local_20.tv_sec = 1;
  local_20.tv_nsec = 0;
  do {
    iVar1 = nanosleep(&local_20,&local_20);
    if (iVar1 != -1) {
      return;
    }
    piVar2 = __errno_location();
  } while (*piVar2 == 4);
  return;
}

Assistant:

void summarycalc::outputstreamtype(int summary_set)
{
	int streamtype = summarycalc_id | 1;
	fwrite(&streamtype, sizeof(streamtype), 1, fout[summary_set]);
	offset_[summary_set] += sizeof(streamtype);
	std::this_thread::sleep_for(std::chrono::milliseconds(PIPE_DELAY));
}